

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_t sVar1;
  char *pcVar2;
  typed_value<unsigned_long,_char> *ptVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<boost::tuples::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_char>
  *ptVar5;
  size_type sVar6;
  ostream *poVar7;
  any *paVar8;
  unsigned_long *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::tuples::cons<long,_boost::tuples::null_type>_>
  *u;
  test_call_type p_Var11;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  divisor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> integer_type;
  variables_map vm;
  options_description description;
  allocator<char> local_1d9;
  undefined1 local_1d8 [40];
  unsigned_long local_1b0;
  undefined1 local_1a8 [32];
  undefined8 local_188 [4];
  undefined1 local_168 [160];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  options_description local_a8 [128];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_168,anon_var_dwarf_1bfc8,(allocator<char> *)local_1d8);
  boost::program_options::options_description::options_description
            (local_a8,(string *)local_168,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)local_168);
  local_188[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_188,"help,h");
  ptVar3 = boost::program_options::value<unsigned_long>();
  local_1b0 = 1000;
  ptVar3 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar3,&local_1b0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"attempts",(char *)ptVar3);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1d8,"int32",&local_1d9);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1d8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"integer",(char *)ptVar4);
  ptVar5 = boost::program_options::
           value<boost::tuples::tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                     ();
  local_1a8._0_8_ = "int32";
  local_1a8._8_4_ = 100;
  boost::tuples::cons<std::__cxx11::string,boost::tuples::cons<long,boost::tuples::null_type>>::
  cons<char_const(&)[6],boost::tuples::cons<int,boost::tuples::null_type>>
            ((cons<std::__cxx11::string,boost::tuples::cons<long,boost::tuples::null_type>> *)
             local_168,
             (cons<const_char_(&)[6],_boost::tuples::cons<int,_boost::tuples::null_type>_> *)
             local_1a8);
  ptVar5 = boost::program_options::
           typed_value<boost::tuples::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_char>
           ::default_value(ptVar5,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
                                   *)local_168);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"divisor",(char *)ptVar5);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_1d8);
  boost::program_options::variables_map::variables_map((variables_map *)local_168);
  local_c8.super_function_base.vtable = (vtable_base *)0x0;
  local_c8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_c8.super_function_base.functor._8_8_ = 0;
  local_c8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_1d8,argc,argv,local_a8,0,&local_c8);
  boost::program_options::store((basic_parsed_options *)local_1d8,(variables_map *)local_168,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_1d8);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_c8);
  boost::program_options::notify((variables_map *)local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1d8,"help",(allocator<char> *)local_1a8);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(local_168 + 0x10),(key_type *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  if (sVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d8,"attempts",(allocator<char> *)local_1a8);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_168);
    puVar9 = boost::any_cast<unsigned_long_const&>(paVar8);
    sVar1 = *puVar9;
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d8,"integer",(allocator<char> *)local_188);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_168);
    pbVar10 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
    std::__cxx11::string::string((string *)local_1a8,(string *)pbVar10);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,"divisor",(allocator<char> *)&local_1b0);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_168);
    u = &boost::
         any_cast<boost::tuples::tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>const&>
                   (paVar8)->super_type;
    boost::tuples::
    cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::tuples::cons<long,_boost::tuples::null_type>_>
    ::cons((cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::tuples::cons<long,_boost::tuples::null_type>_>
            *)local_1d8,u);
    std::__cxx11::string::~string((string *)local_188);
    p_Var11 = get_call((string *)local_1a8,(string *)local_1d8);
    (*p_Var11)(local_1d8._32_8_,sVar1);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  else {
    poVar7 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_a8);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  boost::program_options::variables_map::~variables_map((variables_map *)local_168);
  boost::program_options::options_description::~options_description(local_a8);
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка.")
        ("attempts", bpo::value<std::size_t>()->default_value(1000),
            "Количество испытаний.")
        ("integer", bpo::value<std::string>()->default_value("int32"),
            "Тип сортируемых чисел.\n"
            "Допустимые значения: uint8, uint16, uint32, uint64, int8, int16, int32, int64")
        ("divisor", bpo::value<boost::tuple<std::string, std::int64_t>>()->default_value(boost::make_tuple("int32", 100)),
            "Тип делителя.\n"
            "Допустимые значения: uint8, uint16, uint32, uint64, int8, int16, int32, int64");

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            auto attempts = vm["attempts"].as<std::size_t>();
            auto integer_type = vm["integer"].as<std::string>();
            auto divisor = vm["divisor"].as<boost::tuple<std::string, std::int64_t>>();

            auto test = get_call(integer_type, boost::get<0>(divisor));
            test(boost::get<1>(divisor), attempts);
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}